

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_test.cc
# Opt level: O3

void __thiscall PKCS7Test_SortCertsRaw_Test::TestBody(PKCS7Test_SortCertsRaw_Test *this)

{
  int iVar1;
  CRYPTO_BUFFER *new_cert1;
  CRYPTO_BUFFER *new_cert2;
  CRYPTO_BUFFER *new_cert3;
  undefined1 __ptr [8];
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  char *in_R9;
  UniquePtr<struct_stack_st_CRYPTO_BUFFER> certs;
  anon_class_16_2_66b45f4d check_order;
  string nss_p7c;
  CBS pkcs7;
  AssertHelper local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  AssertHelper local_80;
  undefined1 local_78 [8];
  undefined1 local_70 [8];
  undefined1 local_68 [8];
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  CBS local_30;
  
  GetTestData_abi_cxx11_((string *)(local_60 + 0x10),"crypto/pkcs7/test/nss.p7c");
  local_30.data = (uint8_t *)local_60._16_8_;
  local_30.len = local_60._24_8_;
  local_78 = (undefined1  [8])OPENSSL_sk_new_null();
  local_90._M_head_impl._0_1_ = local_78 != (undefined1  [8])0x0;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_78 == (undefined1  [8])0x0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)&local_90,(AssertionResult *)0x5add24,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0x153,(char *)local_70);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
LAB_00340253:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_88;
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_70 != (undefined1  [8])local_60) {
      operator_delete((void *)local_70,local_60._0_8_ + 1);
    }
    if ((long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) + 8))();
    }
    __ptr = (undefined1  [8])local_88;
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00340308;
  }
  else {
    iVar1 = PKCS7_get_raw_certificates
                      ((stack_st_CRYPTO_BUFFER *)local_78,&local_30,(CRYPTO_BUFFER_POOL *)0x0);
    local_90._M_head_impl._0_1_ = iVar1 != 0;
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_90,
                 (AssertionResult *)"PKCS7_get_raw_certificates(certs.get(), &pkcs7, nullptr)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                 ,0x154,(char *)local_70);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
      goto LAB_00340253;
    }
    local_98.data_._0_4_ = 3;
    local_90._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         OPENSSL_sk_num((OPENSSL_STACK *)local_78);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_70,"3u","sk_CRYPTO_BUFFER_num(certs.get())",(uint *)&local_98,
               (unsigned_long *)&local_90);
    if (local_70[0] != (internal)0x0) {
      if (local_68 != (undefined1  [8])0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
      }
      new_cert1 = (CRYPTO_BUFFER *)OPENSSL_sk_value((OPENSSL_STACK *)local_78,0);
      new_cert2 = (CRYPTO_BUFFER *)OPENSSL_sk_value((OPENSSL_STACK *)local_78,1);
      new_cert3 = (CRYPTO_BUFFER *)OPENSSL_sk_value((OPENSSL_STACK *)local_78,2);
      local_68 = (undefined1  [8])local_78;
      local_70 = (undefined1  [8])(local_60 + 0x10);
      TestBody::anon_class_16_2_66b45f4d::operator()
                ((anon_class_16_2_66b45f4d *)local_70,new_cert1,new_cert2,new_cert3);
      TestBody::anon_class_16_2_66b45f4d::operator()
                ((anon_class_16_2_66b45f4d *)local_70,new_cert3,new_cert2,new_cert1);
      TestBody::anon_class_16_2_66b45f4d::operator()
                ((anon_class_16_2_66b45f4d *)local_70,new_cert2,new_cert3,new_cert1);
      goto LAB_00340308;
    }
    testing::Message::Message((Message *)&local_90);
    if (local_68 == (undefined1  [8])0x0) {
      message = "";
    }
    else {
      message = *(char **)local_68;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0x155,message);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
    if (local_68 == (undefined1  [8])0x0) goto LAB_00340308;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_68;
    __ptr = local_68;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__ptr);
LAB_00340308:
  std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._16_8_ != &local_40) {
    operator_delete((void *)local_60._16_8_,local_40._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(PKCS7Test, SortCertsRaw) {
  // nss.p7c contains three certificates in the canonical DER order.
  std::string nss_p7c = GetTestData("crypto/pkcs7/test/nss.p7c");
  CBS pkcs7 = bssl::StringAsBytes(nss_p7c);
  bssl::UniquePtr<STACK_OF(CRYPTO_BUFFER)> certs(sk_CRYPTO_BUFFER_new_null());
  ASSERT_TRUE(certs);
  ASSERT_TRUE(PKCS7_get_raw_certificates(certs.get(), &pkcs7, nullptr));
  ASSERT_EQ(3u, sk_CRYPTO_BUFFER_num(certs.get()));

  CRYPTO_BUFFER *cert1 = sk_CRYPTO_BUFFER_value(certs.get(), 0);
  CRYPTO_BUFFER *cert2 = sk_CRYPTO_BUFFER_value(certs.get(), 1);
  CRYPTO_BUFFER *cert3 = sk_CRYPTO_BUFFER_value(certs.get(), 2);

  auto check_order = [&](CRYPTO_BUFFER *new_cert1, CRYPTO_BUFFER *new_cert2,
                         CRYPTO_BUFFER *new_cert3) {
    // Bundle the certificates in the new order.
    bssl::UniquePtr<STACK_OF(CRYPTO_BUFFER)> new_certs(
        sk_CRYPTO_BUFFER_new_null());
    ASSERT_TRUE(new_certs);
    ASSERT_TRUE(bssl::PushToStack(new_certs.get(), bssl::UpRef(new_cert1)));
    ASSERT_TRUE(bssl::PushToStack(new_certs.get(), bssl::UpRef(new_cert2)));
    ASSERT_TRUE(bssl::PushToStack(new_certs.get(), bssl::UpRef(new_cert3)));
    bssl::ScopedCBB cbb;
    ASSERT_TRUE(CBB_init(cbb.get(), nss_p7c.size()));
    ASSERT_TRUE(PKCS7_bundle_raw_certificates(cbb.get(), new_certs.get()));

    // The bundle should be sorted back to the original order.
    CBS cbs;
    CBS_init(&cbs, CBB_data(cbb.get()), CBB_len(cbb.get()));
    bssl::UniquePtr<STACK_OF(CRYPTO_BUFFER)> result(
        sk_CRYPTO_BUFFER_new_null());
    ASSERT_TRUE(result);
    ASSERT_TRUE(PKCS7_get_raw_certificates(result.get(), &cbs, nullptr));
    ASSERT_EQ(sk_CRYPTO_BUFFER_num(certs.get()),
              sk_CRYPTO_BUFFER_num(result.get()));
    for (size_t i = 0; i < sk_CRYPTO_BUFFER_num(certs.get()); i++) {
      CRYPTO_BUFFER *a = sk_CRYPTO_BUFFER_value(certs.get(), i);
      CRYPTO_BUFFER *b = sk_CRYPTO_BUFFER_value(result.get(), i);
      EXPECT_EQ(Bytes(CRYPTO_BUFFER_data(a), CRYPTO_BUFFER_len(a)),
                Bytes(CRYPTO_BUFFER_data(b), CRYPTO_BUFFER_len(b)));
    }
  };

  check_order(cert1, cert2, cert3);
  check_order(cert3, cert2, cert1);
  check_order(cert2, cert3, cert1);
}